

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deBool deSocketAddressToBsdAddress
                 (deSocketAddress *address,size_t bsdAddrBufSize,sockaddr *bsdAddr,
                 NativeSocklen *bsdAddrLen)

{
  deUint16 dVar1;
  int iVar2;
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  addrinfo hints;
  addrinfo *result;
  NativeSocklen *bsdAddrLen_local;
  sockaddr *bsdAddr_local;
  size_t bsdAddrBufSize_local;
  deSocketAddress *address_local;
  
  deMemset(bsdAddr,0,bsdAddrBufSize);
  if (address->host == (char *)0x0) {
    if (address->family == DE_SOCKETFAMILY_INET4) {
      if (bsdAddrBufSize < 0x10) {
        address_local._4_4_ = 0;
      }
      else {
        dVar1 = deHostToNetworkOrder16((deUint16)address->port);
        *(deUint16 *)bsdAddr->sa_data = dVar1;
        bsdAddr->sa_family = 2;
        bsdAddr->sa_data[2] = '\0';
        bsdAddr->sa_data[3] = '\0';
        bsdAddr->sa_data[4] = '\0';
        bsdAddr->sa_data[5] = '\0';
        *bsdAddrLen = 0x10;
        address_local._4_4_ = 1;
      }
    }
    else if (address->family == DE_SOCKETFAMILY_INET6) {
      if (bsdAddrBufSize < 0x1c) {
        address_local._4_4_ = 0;
      }
      else {
        dVar1 = deHostToNetworkOrder16((deUint16)address->port);
        *(deUint16 *)bsdAddr->sa_data = dVar1;
        bsdAddr->sa_family = 10;
        *bsdAddrLen = 0x1c;
        address_local._4_4_ = 1;
      }
    }
    else {
      address_local._4_4_ = 0;
    }
  }
  else {
    hints.ai_next = (addrinfo *)0x0;
    deMemset(&addr4,0,0x30);
    addr4._4_4_ = deSocketFamilyToBsdFamily(address->family);
    hints.ai_flags = deSocketTypeToBsdType(address->type);
    hints.ai_family = deSocketProtocolToBsdProtocol(address->protocol);
    iVar2 = getaddrinfo(address->host,(char *)0x0,(addrinfo *)&addr4,(addrinfo **)&hints.ai_next);
    if ((iVar2 == 0) && (hints.ai_next != (addrinfo *)0x0)) {
      if (bsdAddrBufSize < (hints.ai_next)->ai_addrlen) {
        freeaddrinfo((addrinfo *)hints.ai_next);
        address_local._4_4_ = 0;
      }
      else {
        *bsdAddrLen = (hints.ai_next)->ai_addrlen;
        deMemcpy(bsdAddr,(hints.ai_next)->ai_addr,(ulong)(hints.ai_next)->ai_addrlen);
        freeaddrinfo((addrinfo *)hints.ai_next);
        if (bsdAddr->sa_family == 2) {
          if (*bsdAddrLen < 0x10) {
            return 0;
          }
          dVar1 = deHostToNetworkOrder16((deUint16)address->port);
          *(deUint16 *)bsdAddr->sa_data = dVar1;
        }
        else {
          if (bsdAddr->sa_family != 10) {
            return 0;
          }
          if (*bsdAddrLen < 0x1c) {
            return 0;
          }
          dVar1 = deHostToNetworkOrder16((deUint16)address->port);
          *(deUint16 *)bsdAddr->sa_data = dVar1;
        }
        address_local._4_4_ = 1;
      }
    }
    else {
      if (hints.ai_next != (addrinfo *)0x0) {
        freeaddrinfo((addrinfo *)hints.ai_next);
      }
      address_local._4_4_ = 0;
    }
  }
  return address_local._4_4_;
}

Assistant:

static deBool deSocketAddressToBsdAddress (const deSocketAddress* address, size_t bsdAddrBufSize, struct sockaddr* bsdAddr, NativeSocklen* bsdAddrLen)
{
	deMemset(bsdAddr, 0, bsdAddrBufSize);

	/* Resolve host. */
	if (address->host != DE_NULL)
	{
		struct addrinfo*	result	= DE_NULL;
		struct addrinfo		hints;

		deMemset(&hints, 0, sizeof(hints));
		hints.ai_family		= deSocketFamilyToBsdFamily(address->family);
		hints.ai_socktype	= deSocketTypeToBsdType(address->type);
		hints.ai_protocol	= deSocketProtocolToBsdProtocol(address->protocol);

		if (getaddrinfo(address->host, DE_NULL, &hints, &result) != 0 || !result)
		{
			if (result)
				freeaddrinfo(result);
			return DE_FALSE;
		}

		/* \note Always uses first address. */

		if (bsdAddrBufSize < (size_t)result->ai_addrlen)
		{
			DE_FATAL("Too small bsdAddr buffer");
			freeaddrinfo(result);
			return DE_FALSE;
		}

		*bsdAddrLen	= (NativeSocklen)result->ai_addrlen;

		deMemcpy(bsdAddr, result->ai_addr, (size_t)result->ai_addrlen);
		freeaddrinfo(result);

		/* Add port. */
		if (bsdAddr->sa_family == AF_INET)
		{
			if (*bsdAddrLen < (NativeSocklen)sizeof(struct sockaddr_in))
				return DE_FALSE;
			((struct sockaddr_in*)bsdAddr)->sin_port = deHostToNetworkOrder16((deUint16)address->port);
		}
		else if (bsdAddr->sa_family == AF_INET6)
		{
			if (*bsdAddrLen < (NativeSocklen)sizeof(struct sockaddr_in6))
				return DE_FALSE;
			((struct sockaddr_in6*)bsdAddr)->sin6_port = deHostToNetworkOrder16((deUint16)address->port);
		}
		else
			return DE_FALSE;

		return DE_TRUE;
	}
	else if (address->family == DE_SOCKETFAMILY_INET4)
	{
		struct sockaddr_in* addr4 = (struct sockaddr_in*)bsdAddr;

		if (bsdAddrBufSize < sizeof(struct sockaddr_in))
		{
			DE_FATAL("Too small bsdAddr buffer");
			return DE_FALSE;
		}

		addr4->sin_port			= deHostToNetworkOrder16((deUint16)address->port);
		addr4->sin_family		= AF_INET;
		addr4->sin_addr.s_addr	= INADDR_ANY;

		*bsdAddrLen	= (NativeSocklen)sizeof(struct sockaddr_in);

		return DE_TRUE;
	}
	else if (address->family == DE_SOCKETFAMILY_INET6)
	{
		struct sockaddr_in6* addr6 = (struct sockaddr_in6*)bsdAddr;

		if (bsdAddrBufSize < sizeof(struct sockaddr_in6))
		{
			DE_FATAL("Too small bsdAddr buffer");
			return DE_FALSE;
		}

		addr6->sin6_port	= deHostToNetworkOrder16((deUint16)address->port);
		addr6->sin6_family	= AF_INET6;

		*bsdAddrLen	= (NativeSocklen)sizeof(struct sockaddr_in6);

		return DE_TRUE;
	}
	else
		return DE_FALSE;
}